

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

SecretKey * jbcoin::randomSecretKey(void)

{
  csprng_engine *g;
  SecretKey *in_RDI;
  Slice local_50;
  undefined1 local_39;
  undefined1 local_38 [8];
  uint8_t buf [32];
  SecretKey *sk;
  
  g = crypto_prng();
  beast::rngfill<jbcoin::csprng_engine>(local_38,0x20,g);
  local_39 = 0;
  Slice::Slice(&local_50,local_38,0x20);
  SecretKey::SecretKey(in_RDI,&local_50);
  beast::secure_erase<void>(local_38,0x20);
  return in_RDI;
}

Assistant:

SecretKey
randomSecretKey()
{
    std::uint8_t buf[32];
    beast::rngfill(
        buf,
        sizeof(buf),
        crypto_prng());
    SecretKey sk(Slice{ buf, sizeof(buf) });
    beast::secure_erase(buf, sizeof(buf));
    return sk;
}